

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2
          (cmGlobalUnixMakefileGenerator3 *this,ostream *ruleFileStream,
          cmLocalUnixMakefileGenerator3 *lg)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  char *path;
  string dir;
  allocator local_9a;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)lg);
  if (!bVar1) {
    pcVar2 = cmLocalGenerator::GetBinaryDirectory((cmLocalGenerator *)lg);
    std::__cxx11::string::string((string *)&local_58,pcVar2,&local_99);
    pcVar2 = cmLocalGenerator::GetCurrentBinaryDirectory((cmLocalGenerator *)lg);
    std::__cxx11::string::string((string *)&local_78,pcVar2,&local_9a);
    cmOutputConverter::ConvertToRelativePath
              (&local_38,
               &(lg->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
               &local_58,&local_78);
    cmSystemTools::ConvertToOutputPath_abi_cxx11_
              (&local_98,(cmSystemTools *)local_38._M_dataplus._M_p,path);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    cmLocalUnixMakefileGenerator3::WriteDivider(lg,ruleFileStream);
    std::__ostream_insert<char,std::char_traits<char>>
              (ruleFileStream,"# Directory level rules for directory ",0x26);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (ruleFileStream,local_98._M_dataplus._M_p,local_98._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n\n",2);
    WriteDirectoryRule2(this,ruleFileStream,lg,"all",true,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"clean",false,false);
    WriteDirectoryRule2(this,ruleFileStream,lg,"preinstall",true,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteDirectoryRules2(
  std::ostream& ruleFileStream, cmLocalUnixMakefileGenerator3* lg)
{
  // Only subdirectories need these rules.
  if (lg->IsRootMakefile()) {
    return;
  }

  // Begin the directory-level rules section.
  std::string dir = cmSystemTools::ConvertToOutputPath(
    lg->ConvertToRelativePath(lg->GetBinaryDirectory(),
                              lg->GetCurrentBinaryDirectory())
      .c_str());
  lg->WriteDivider(ruleFileStream);
  ruleFileStream << "# Directory level rules for directory " << dir << "\n\n";

  // Write directory-level rules for "all".
  this->WriteDirectoryRule2(ruleFileStream, lg, "all", true, false);

  // Write directory-level rules for "clean".
  this->WriteDirectoryRule2(ruleFileStream, lg, "clean", false, false);

  // Write directory-level rules for "preinstall".
  this->WriteDirectoryRule2(ruleFileStream, lg, "preinstall", true, true);
}